

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall
google::protobuf::UninterpretedOption_NamePart::ByteSize(UninterpretedOption_NamePart *this)

{
  byte bVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar5 = (uint)bVar1;
  if (bVar1 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if ((bVar1 & 1) != 0) {
      iVar3 = internal::WireFormatLite::StringSize(this->name_part_);
      iVar3 = iVar3 + 1;
      uVar5 = this->_has_bits_[0];
    }
    iVar3 = (uVar5 & 2) + iVar3;
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar3 = iVar3 + iVar4;
  }
  this->_cached_size_ = iVar3;
  return iVar3;
}

Assistant:

int UninterpretedOption_NamePart::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // required string name_part = 1;
    if (has_name_part()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name_part());
    }

    // required bool is_extension = 2;
    if (has_is_extension()) {
      total_size += 1 + 1;
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}